

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iostream.cpp
# Opt level: O2

void __thiscall stdio_stream_ops_wide_Test::TestBody(stdio_stream_ops_wide_Test *this)

{
  char *pcVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  wostream *stream;
  char *pcVar3;
  AssertHelper local_210;
  AssertionResult gtest_ar;
  buffer<char> local_1f8;
  string y;
  string x;
  wstringstream sstream;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> local_188 [376];
  
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&sstream);
  pcVar3 = x.m_buffer.m_data;
  x.m_buffer.m_size = 5;
  x.m_buffer.m_data[6] = '\0';
  x.m_buffer.m_data[7] = '\0';
  x.m_buffer.m_data[8] = '\0';
  x.m_buffer.m_data[9] = '\0';
  x.m_buffer.m_data[10] = '\0';
  x.m_buffer.m_data[0xb] = '\0';
  x.m_buffer.m_data[0xc] = '\0';
  x.m_buffer.m_data[0xd] = '\0';
  x.m_buffer.m_data[0xe] = '\0';
  x.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(x.m_buffer.m_data,"xxxxx",6);
  x.m_buffer.m_chars = pcVar3;
  pbVar2 = ::operator<<(local_188,&x);
  stream = std::operator<<((wostream *)pbVar2,L" ");
  pcVar1 = y.m_buffer.m_data;
  y.m_buffer.m_size = 5;
  y.m_buffer.m_data[6] = '\0';
  y.m_buffer.m_data[7] = '\0';
  y.m_buffer.m_data[8] = '\0';
  y.m_buffer.m_data[9] = '\0';
  y.m_buffer.m_data[10] = '\0';
  y.m_buffer.m_data[0xb] = '\0';
  y.m_buffer.m_data[0xc] = '\0';
  y.m_buffer.m_data[0xd] = '\0';
  y.m_buffer.m_data[0xe] = '\0';
  y.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(y.m_buffer.m_data,"yyyyy",6);
  y.m_buffer.m_chars = pcVar1;
  ::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)stream,&y);
  ST::buffer<char>::~buffer(&y.m_buffer);
  ST::buffer<char>::~buffer(&x.m_buffer);
  std::wistream::seekg(&sstream,0,0);
  x.m_buffer.m_size = 0;
  x.m_buffer.m_data[0] = '\0';
  x.m_buffer.m_data[1] = '\0';
  x.m_buffer.m_data[2] = '\0';
  x.m_buffer.m_data[3] = '\0';
  x.m_buffer.m_data[4] = '\0';
  x.m_buffer.m_data[5] = '\0';
  x.m_buffer.m_data[6] = '\0';
  x.m_buffer.m_data[7] = '\0';
  x.m_buffer.m_data[8] = '\0';
  x.m_buffer.m_data[9] = '\0';
  x.m_buffer.m_data[10] = '\0';
  x.m_buffer.m_data[0xb] = '\0';
  x.m_buffer.m_data[0xc] = '\0';
  x.m_buffer.m_data[0xd] = '\0';
  x.m_buffer.m_data[0xe] = '\0';
  x.m_buffer.m_data[0xf] = '\0';
  y.m_buffer.m_size = 0;
  y.m_buffer.m_data[0] = '\0';
  y.m_buffer.m_data[1] = '\0';
  y.m_buffer.m_data[2] = '\0';
  y.m_buffer.m_data[3] = '\0';
  y.m_buffer.m_data[4] = '\0';
  y.m_buffer.m_data[5] = '\0';
  y.m_buffer.m_data[6] = '\0';
  y.m_buffer.m_data[7] = '\0';
  y.m_buffer.m_data[8] = '\0';
  y.m_buffer.m_data[9] = '\0';
  y.m_buffer.m_data[10] = '\0';
  y.m_buffer.m_data[0xb] = '\0';
  y.m_buffer.m_data[0xc] = '\0';
  y.m_buffer.m_data[0xd] = '\0';
  y.m_buffer.m_data[0xe] = '\0';
  y.m_buffer.m_data[0xf] = '\0';
  y.m_buffer.m_chars = pcVar1;
  x.m_buffer.m_chars = pcVar3;
  operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)&sstream,&x);
  operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)&sstream,&y);
  local_1f8.m_size = 5;
  local_1f8.m_data[6] = '\0';
  local_1f8.m_data[7] = '\0';
  local_1f8.m_data[8] = '\0';
  local_1f8.m_data[9] = '\0';
  local_1f8.m_data[10] = '\0';
  local_1f8.m_data[0xb] = '\0';
  local_1f8.m_data[0xc] = '\0';
  local_1f8.m_data[0xd] = '\0';
  local_1f8.m_data[0xe] = '\0';
  local_1f8.m_data[0xf] = '\0';
  builtin_strncpy(local_1f8.m_data,"xxxxx",6);
  local_1f8.m_chars = local_1f8.m_data;
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)&gtest_ar,
             "ST::string::from_validated(\"\" \"xxxxx\" \"\", sizeof(\"xxxxx\") - 1)","x",
             (string *)&local_1f8,&x);
  ST::buffer<char>::~buffer(&local_1f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_iostream.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if (local_1f8.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_1f8.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_1f8.m_size = 5;
  local_1f8.m_data[6] = '\0';
  local_1f8.m_data[7] = '\0';
  local_1f8.m_data[8] = '\0';
  local_1f8.m_data[9] = '\0';
  local_1f8.m_data[10] = '\0';
  local_1f8.m_data[0xb] = '\0';
  local_1f8.m_data[0xc] = '\0';
  local_1f8.m_data[0xd] = '\0';
  local_1f8.m_data[0xe] = '\0';
  local_1f8.m_data[0xf] = '\0';
  builtin_strncpy(local_1f8.m_data,"yyyyy",6);
  local_1f8.m_chars = local_1f8.m_data;
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)&gtest_ar,
             "ST::string::from_validated(\"\" \"yyyyy\" \"\", sizeof(\"yyyyy\") - 1)","y",
             (string *)&local_1f8,&y);
  ST::buffer<char>::~buffer(&local_1f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_iostream.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if (local_1f8.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_1f8.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ST::buffer<char>::~buffer(&y.m_buffer);
  ST::buffer<char>::~buffer(&x.m_buffer);
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)&sstream);
  return;
}

Assistant:

TEST(stdio, stream_ops_wide)
{
    std::wstringstream sstream;
    sstream << ST_LITERAL("xxxxx") << L" " << ST_LITERAL("yyyyy");

    sstream.seekg(0);
    ST::string x, y;
    sstream >> x;
    sstream >> y;

    EXPECT_EQ(ST_LITERAL("xxxxx"), x);
    EXPECT_EQ(ST_LITERAL("yyyyy"), y);
}